

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(*)(_object_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
::operator()(impl<void_(*)(_object_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  PyObject *pPVar3;
  c_t0 c0;
  c_t2 c2;
  c_t1 c1;
  c_t3 c3;
  PyTypeObject *local_d8;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  long *local_b8 [2];
  long local_a8 [2];
  PyTypeObject *local_98;
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  _object *local_58;
  undefined1 local_40 [16];
  _object *local_28;
  
  local_d8 = args_[1].ob_type;
  p_Var1 = (_object *)args_[2].ob_refcnt;
  local_88 = converter::rvalue_from_python_stage1
                       (p_Var1,converter::detail::
                               registered_base<std::__cxx11::string_const_volatile&>::converters);
  if (local_88._0_8_ == 0) {
    pPVar3 = (PyObject *)0x0;
  }
  else {
    pPVar2 = args_[2].ob_type;
    local_58 = p_Var1;
    local_c8 = converter::rvalue_from_python_stage1
                         ((_object *)pPVar2,
                          converter::detail::registered_base<std::__cxx11::string_const_volatile&>::
                          converters);
    local_98 = pPVar2;
    if (local_c8._0_8_ == 0) {
      pPVar3 = (PyObject *)0x0;
    }
    else {
      p_Var1 = (_object *)args_[3].ob_refcnt;
      local_40 = converter::rvalue_from_python_stage1
                           (p_Var1,converter::detail::registered_base<int_const_volatile&>::
                                   converters);
      local_28 = p_Var1;
      if (local_40._0_8_ == 0) {
        pPVar3 = (PyObject *)0x0;
      }
      else {
        local_cc = 0;
        pPVar3 = invoke<int,void(*)(_object*,std::__cxx11::string,std::__cxx11::string,int),boost::python::arg_from_python<_object*>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<std::__cxx11::string>,boost::python::arg_from_python<int>>
                           (&local_cc,this,&local_d8,local_88,local_c8,local_40);
      }
      if (((long **)local_c8._0_8_ == local_b8) && (local_b8[0] != local_a8)) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
    }
    if (((long **)local_88._0_8_ == local_78) && (local_78[0] != local_68)) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  return pPVar3;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }